

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

int __thiscall re2::DFA::BuildAllStates(DFA *this)

{
  State *state;
  bool bVar1;
  iterator iVar2;
  int c;
  int iVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> q;
  State *ns;
  RWLocker l;
  StateSet queued;
  _Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> local_f8;
  State *local_d8;
  RWLocker local_d0;
  _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_c0;
  SearchParams local_88;
  
  iVar3 = 0;
  if (this->init_failed_ == false) {
    local_d0.mu_ = &this->cache_mutex_;
    uVar5 = 0;
    local_d0.writing_ = false;
    Mutex::ReaderLock(local_d0.mu_);
    local_88.text.ptr_ = (char *)0x0;
    local_88.text.length_ = 0;
    local_88.context.ptr_ = (char *)0x0;
    local_88.context.length_ = 0;
    local_88.run_forward = false;
    local_88.start = (State *)0x0;
    local_88.firstbyte = -1;
    local_88.failed = false;
    local_88.ep = (char *)0x0;
    local_88.matches = (vector<int,_std::allocator<int>_> *)0x0;
    local_88.anchored = false;
    local_88.want_earliest_match = false;
    local_88.cache_lock = &local_d0;
    bVar1 = AnalyzeSearch(this,&local_88);
    if (bVar1 && (State *)0x2 < local_88.start) {
      local_c0._M_buckets = &local_c0._M_single_bucket;
      local_c0._M_bucket_count = 1;
      local_c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_c0._M_element_count = 0;
      local_c0._M_rehash_policy._M_max_load_factor = 1.0;
      local_c0._M_rehash_policy._M_next_resize = 0;
      local_c0._M_single_bucket = (__node_base_ptr)0x0;
      local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__detail::
      _Insert_base<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&local_c0,&local_88.start);
      std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::push_back
                ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)&local_f8,
                 &local_88.start);
      uVar4 = 0;
      while( true ) {
        uVar5 = (long)local_f8._M_impl.super__Vector_impl_data._M_finish -
                (long)local_f8._M_impl.super__Vector_impl_data._M_start >> 3;
        if (uVar5 <= uVar4) break;
        state = local_f8._M_impl.super__Vector_impl_data._M_start[uVar4];
        for (iVar3 = 0; iVar3 != 0x101; iVar3 = iVar3 + 1) {
          local_d8 = RunStateOnByteUnlocked(this,state,iVar3);
          if ((State *)0x2 < local_d8) {
            iVar2 = std::
                    _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::find(&local_c0,&local_d8);
            if (iVar2.super__Node_iterator_base<re2::DFA::State_*,_true>._M_cur ==
                (__node_type *)0x0) {
              std::__detail::
              _Insert_base<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::insert((_Insert_base<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)&local_c0,&local_d8);
              std::vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::push_back
                        ((vector<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_> *)&local_f8,
                         &local_d8);
            }
          }
        }
        uVar4 = uVar4 + 1;
      }
      std::_Vector_base<re2::DFA::State_*,_std::allocator<re2::DFA::State_*>_>::~_Vector_base
                (&local_f8);
      std::
      _Hashtable<re2::DFA::State_*,_re2::DFA::State_*,_std::allocator<re2::DFA::State_*>,_std::__detail::_Identity,_re2::DFA::StateEqual,_re2::DFA::StateHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_c0);
    }
    iVar3 = (int)uVar5;
    RWLocker::~RWLocker(&local_d0);
  }
  return iVar3;
}

Assistant:

int DFA::BuildAllStates() {
  if (!ok())
    return 0;

  // Pick out start state for unanchored search
  // at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(NULL, NULL, &l);
  params.anchored = false;
  if (!AnalyzeSearch(&params) || params.start <= SpecialStateMax)
    return 0;

  // Add start state to work queue.
  StateSet queued;
  vector<State*> q;
  queued.insert(params.start);
  q.push_back(params.start);

  // Flood to expand every state.
  for (size_t i = 0; i < q.size(); i++) {
    State* s = q[i];
    for (int c = 0; c < 257; c++) {
      State* ns = RunStateOnByteUnlocked(s, c);
      if (ns > SpecialStateMax && queued.find(ns) == queued.end()) {
        queued.insert(ns);
        q.push_back(ns);
      }
    }
  }

  return static_cast<int>(q.size());
}